

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _dequeIterator.hpp
# Opt level: O2

dequeIterator<int,_64UL> * __thiscall
ft::dequeIterator<int,_64UL>::operator--(dequeIterator<int,_64UL> *this)

{
  map_pointer ppvVar1;
  pointer pvVar2;
  
  pvVar2 = this->m_cur;
  if (pvVar2 == this->m_first) {
    ppvVar1 = this->m_node;
    this->m_node = ppvVar1 + -1;
    pvVar2 = ppvVar1[-1];
    this->m_first = pvVar2;
    pvVar2 = pvVar2 + 0x40;
    this->m_last = pvVar2;
  }
  this->m_cur = pvVar2 + -1;
  return this;
}

Assistant:

dequeIterator&	operator--() {
		if (this->m_cur == this->m_first) {
			this->setNode(this->m_node - 1);
			this->m_cur = this->m_last;
		}
		--this->m_cur;
		return *this;
	}